

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledOutputFile::setFrameBuffer(TiledOutputFile *this,FrameBuffer *frameBuffer)

{
  undefined8 *puVar1;
  Data *pDVar2;
  pointer pTVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined3 uVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  PixelType PVar12;
  undefined4 uVar13;
  pointer pTVar14;
  TOutSliceInfo *__cur;
  ChannelList *this_00;
  const_iterator cVar15;
  ConstIterator CVar16;
  ConstIterator CVar17;
  const_iterator cVar18;
  pointer pTVar19;
  long lVar20;
  pointer pTVar21;
  ArgExc *pAVar22;
  ostream *poVar23;
  char *pcVar24;
  size_t __n;
  ulong __n_00;
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
  slices;
  Lock local_1c8;
  stringstream _iex_throw_s;
  size_t sStack_1a8;
  size_t sStack_1a0;
  bool local_198;
  ulong local_194;
  
  local_1c8._mutex = &this->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  this_00 = Header::channels(&this->_data->header);
  cVar15._M_node = (_Base_ptr)ChannelList::begin(this_00);
  do {
    CVar16 = ChannelList::end(this_00);
    if ((const_iterator)cVar15._M_node == CVar16._i._M_node) {
      slices.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      slices.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      slices.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar15._M_node = (_Base_ptr)ChannelList::begin(this_00);
      while( true ) {
        CVar16 = ChannelList::end(this_00);
        if ((const_iterator)cVar15._M_node == CVar16._i._M_node) break;
        CVar17 = FrameBuffer::find(frameBuffer,(char *)(cVar15._M_node + 1));
        cVar18._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
        if (CVar17._i._M_node == (const_iterator)cVar18._M_node) {
          __iex_throw_s = cVar15._M_node[9]._M_color;
          sStack_1a8 = 0;
          sStack_1a0 = 0;
          local_198 = true;
          local_194 = 0;
          std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back(&slices,(value_type *)&_iex_throw_s);
        }
        else {
          __iex_throw_s = *(_Rb_tree_color *)((long)CVar17._i._M_node + 0x120);
          sStack_1a8 = *(size_t *)((long)CVar17._i._M_node + 0x130);
          sStack_1a0 = *(size_t *)((long)CVar17._i._M_node + 0x138);
          local_198 = false;
          local_194 = (ulong)CONCAT14(*(undefined1 *)((long)CVar17._i._M_node + 0x151),
                                      (uint)*(byte *)((long)CVar17._i._M_node + 0x150));
          std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back(&slices,(value_type *)&_iex_throw_s);
        }
        cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&this->_data->frameBuffer,
                  (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)frameBuffer);
      pTVar14 = slices.
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pTVar3 = slices.
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 = this->_data;
      __n_00 = (long)slices.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)slices.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar19 = (pDVar2->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar2->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar19) < __n_00
         ) {
        pTVar19 = std::
                  _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                 *)((long)__n_00 / 0x30),(size_t)frameBuffer);
        for (lVar20 = 0; pTVar21 = (pointer)((long)&pTVar3->type + lVar20), pTVar21 != pTVar14;
            lVar20 = lVar20 + 0x30) {
          puVar1 = (undefined8 *)((long)&pTVar19->type + lVar20);
          uVar4 = *(undefined8 *)pTVar21;
          pcVar24 = pTVar21->base;
          sVar5 = pTVar21->xStride;
          sVar6 = pTVar21->yStride;
          uVar7 = *(undefined8 *)&pTVar21->yTileCoords;
          puVar1[4] = *(undefined8 *)&pTVar21->zero;
          puVar1[5] = uVar7;
          puVar1[2] = sVar5;
          puVar1[3] = sVar6;
          *puVar1 = uVar4;
          puVar1[1] = pcVar24;
        }
        pTVar3 = (pDVar2->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)(pDVar2->slices).
                       super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar3;
        std::
        _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
        ::_M_deallocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                         *)pTVar3,(pointer)(lVar20 / 0x30),lVar20 % 0x30);
        (pDVar2->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar19;
        (pDVar2->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar19 + __n_00);
      }
      else {
        pTVar21 = (pDVar2->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pTVar21 - (long)pTVar19;
        if (__n < __n_00) {
          if (pTVar21 != pTVar19) {
            memmove(pTVar19,slices.
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
            pTVar21 = (pDVar2->slices).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __n = (long)pTVar21 -
                  (long)(pDVar2->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          }
          for (pTVar19 = (pointer)((long)&pTVar3->type + __n); pTVar19 != pTVar14;
              pTVar19 = pTVar19 + 1) {
            PVar12 = pTVar19->type;
            uVar13 = *(undefined4 *)&pTVar19->field_0x4;
            pcVar24 = pTVar19->base;
            sVar5 = pTVar19->xStride;
            sVar6 = pTVar19->yStride;
            uVar8 = *(undefined3 *)&pTVar19->field_0x21;
            iVar9 = pTVar19->xTileCoords;
            iVar10 = pTVar19->yTileCoords;
            uVar11 = *(undefined4 *)&pTVar19->field_0x2c;
            pTVar21->zero = pTVar19->zero;
            *(undefined3 *)&pTVar21->field_0x21 = uVar8;
            pTVar21->xTileCoords = iVar9;
            pTVar21->yTileCoords = iVar10;
            *(undefined4 *)&pTVar21->field_0x2c = uVar11;
            pTVar21->xStride = sVar5;
            pTVar21->yStride = sVar6;
            pTVar21->type = PVar12;
            *(undefined4 *)&pTVar21->field_0x4 = uVar13;
            pTVar21->base = pcVar24;
            pTVar21 = pTVar21 + 1;
          }
        }
        else if (slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pTVar19,slices.
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(__n_00 + (long)(pDVar2->slices).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ::~vector(&slices);
      IlmThread_2_5::Lock::~Lock(&local_1c8);
      return;
    }
    CVar17 = FrameBuffer::find(frameBuffer,(char *)(cVar15._M_node + 1));
    cVar18._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
    if (CVar17._i._M_node != (const_iterator)cVar18._M_node) {
      if (cVar15._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar17._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar23 = std::operator<<((ostream *)&sStack_1a8,"Pixel type of \"");
        poVar23 = std::operator<<(poVar23,(char *)(cVar15._M_node + 1));
        poVar23 = std::operator<<(poVar23,"\" channel of output file \"");
        pcVar24 = fileName(this);
        poVar23 = std::operator<<(poVar23,pcVar24);
        std::operator<<(poVar23,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar22,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar17._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar17._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        std::operator<<((ostream *)&sStack_1a8,
                        "All channels in a tiled file must havesampling (1,1).");
        pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar22,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
  } while( true );
}

Assistant:

void	
TiledOutputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	    continue;

	if (i.channel().type != j.slice().type)
	    THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
				"of output file \"" << fileName() << "\" is "
				"not compatible with the frame buffer's "
				"pixel type.");

	if (j.slice().xSampling != 1 || j.slice().ySampling != 1)
	    THROW (IEX_NAMESPACE::ArgExc, "All channels in a tiled file must have"
				"sampling (1,1).");
    }
    
    //
    // Initialize slice table for writePixels().
    //

    vector<TOutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	{
	    //
	    // Channel i is not present in the frame buffer.
	    // In the file, channel i will contain only zeroes.
	    //

	    slices.push_back (TOutSliceInfo (i.channel().type,
					     0, // base
					     0, // xStride,
					     0, // yStride,
					     true)); // zero
	}
	else
	{
	    //
	    // Channel i is present in the frame buffer.
	    //

	    slices.push_back (TOutSliceInfo (j.slice().type,
					     j.slice().base,
					     j.slice().xStride,
					     j.slice().yStride,
					     false, // zero
                                             (j.slice().xTileCoords)? 1: 0,
                                             (j.slice().yTileCoords)? 1: 0));
	}
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}